

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

flatcc_builder_ref_t *
flatcc_builder_append_offset_vector(flatcc_builder_t *B,flatcc_builder_ref_t *refs,size_t count)

{
  uint uVar1;
  __flatcc_builder_frame_t *p_Var2;
  int iVar3;
  flatcc_builder_ref_t *pfVar4;
  uint uVar5;
  uint8_t *__dest;
  uint uVar6;
  
  p_Var2 = B->frame;
  if (p_Var2->type != 5) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_offset_vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x3c9,
                  "flatcc_builder_ref_t *flatcc_builder_append_offset_vector(flatcc_builder_t *, const flatcc_builder_ref_t *, size_t)"
                 );
  }
  uVar1 = (p_Var2->container).table.pl_end;
  uVar6 = (uint)count;
  uVar5 = uVar1 + uVar6;
  if ((CARRY4(uVar1,uVar6)) || (0x3fffffff < uVar5)) {
    __assert_fail("n <= n1 && n1 <= max_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x391,
                  "int vector_count_add(flatcc_builder_t *, flatbuffers_uoffset_t, flatbuffers_uoffset_t)"
                 );
  }
  (p_Var2->container).table.pl_end = uVar5;
  uVar1 = B->ds_offset;
  uVar5 = uVar1 + uVar6 * 4;
  B->ds_offset = uVar5;
  if (B->ds_limit <= uVar5) {
    iVar3 = reserve_ds(B,(ulong)(uVar5 + 1),0xfffffffc);
    if (iVar3 != 0) {
      __dest = (uint8_t *)0x0;
      goto LAB_0011ef6f;
    }
  }
  __dest = B->ds + uVar1;
LAB_0011ef6f:
  if (__dest != (uint8_t *)0x0) {
    pfVar4 = (flatcc_builder_ref_t *)memcpy(__dest,refs,(ulong)(uVar6 << 2));
    return pfVar4;
  }
  return (flatcc_builder_ref_t *)0x0;
}

Assistant:

flatcc_builder_ref_t *flatcc_builder_append_offset_vector(flatcc_builder_t *B, const flatcc_builder_ref_t *refs, size_t count)
{
    check(frame(type) == flatcc_builder_offset_vector, "expected offset vector frame");
    if (vector_count_add(B, (uoffset_t)count, max_offset_count)) {
        return 0;
    }
    return push_ds_copy(B, refs, (uoffset_t)(field_size * count));
}